

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O2

int coda_ascii_cursor_read_string(coda_cursor *cursor,char *dst,long dst_size)

{
  ulong uVar1;
  int iVar2;
  char *message;
  coda_type *pcVar3;
  long length;
  int64_t bit_size_boundary;
  
  pcVar3 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
  if (99 < pcVar3->format) {
    pcVar3 = *(coda_type **)&pcVar3->type_class;
  }
  uVar1 = cursor->stack[(long)cursor->n + -1].bit_offset;
  if ((uVar1 & 7) != 0) {
    message = "product error detected (text does not start at byte boundary)";
LAB_0011b7a1:
    coda_set_error(-300,message);
    return -1;
  }
  if (pcVar3->bit_size < 0) {
    iVar2 = coda_ascii_cursor_get_bit_size(cursor,&bit_size_boundary);
    if (iVar2 != 0) {
      return -1;
    }
    if ((bit_size_boundary & 7U) != 0) {
      message = "product error detected (text does not have a rounded byte size)";
      goto LAB_0011b7a1;
    }
  }
  else {
    iVar2 = get_bit_size_boundary(cursor,&bit_size_boundary,pcVar3->bit_size);
    if (iVar2 != 0) {
      return -1;
    }
    bit_size_boundary = pcVar3->bit_size;
  }
  length = dst_size + -1;
  if (bit_size_boundary >> 3 < dst_size) {
    length = bit_size_boundary >> 3;
  }
  if (length < 1) {
    *dst = '\0';
  }
  else {
    iVar2 = read_bytes(cursor->product,(long)uVar1 >> 3,length,dst);
    if (iVar2 != 0) {
      return -1;
    }
    dst[length] = '\0';
  }
  return 0;
}

Assistant:

int coda_ascii_cursor_read_string(const coda_cursor *cursor, char *dst, long dst_size)
{
    coda_type *type = coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type);
    int64_t bit_offset = cursor->stack[cursor->n - 1].bit_offset;
    int64_t read_size = 0;

    if ((bit_offset & 0x7) != 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not start at byte boundary)");
        return -1;
    }
    if (type->bit_size < 0)
    {
        int64_t bit_size;

        if (coda_ascii_cursor_get_bit_size(cursor, &bit_size) != 0)
        {
            return -1;
        }
        if ((bit_size & 0x7) != 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "product error detected (text does not have a rounded byte size)");
            return -1;
        }
        read_size = bit_size >> 3;
    }
    else
    {
        int64_t bit_size_boundary;

        /* get_bit_size_boundary() will check that type->bit_size is within the expected boundaries */
        if (get_bit_size_boundary(cursor, &bit_size_boundary, type->bit_size) != 0)
        {
            return -1;
        }
        read_size = type->bit_size >> 3;
    }
    if (read_size + 1 > dst_size)       /* account for terminating zero */
    {
        read_size = dst_size - 1;
    }
    if (read_size > 0)
    {
        if (read_bytes(cursor->product, bit_offset >> 3, read_size, dst) != 0)
        {
            return -1;
        }
        dst[read_size] = '\0';
    }
    else
    {
        dst[0] = '\0';
    }

    return 0;
}